

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddSupportNegativeCube(DdManager *dd,DdNode *f)

{
  int *support_00;
  ulong uVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int local_54;
  int local_50;
  int local_48;
  int size;
  int j;
  int i;
  DdNode *var;
  DdNode *tmp;
  DdNode *res;
  int *support;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_50 = dd->sizeZ;
  }
  else {
    local_50 = dd->size;
  }
  support_00 = (int *)malloc((long)local_50 << 2);
  if (support_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (size = 0; size < local_50; size = size + 1) {
      support_00[size] = 0;
    }
    ddSupportStep2((DdNode *)((ulong)f & 0xfffffffffffffffe),support_00);
    ddClearFlag2((DdNode *)((ulong)f & 0xfffffffffffffffe));
    do {
      dd->reordered = 0;
      tmp = dd->one;
      uVar1 = (ulong)tmp & 0xfffffffffffffffe;
      *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
      local_48 = local_50;
      while (local_48 = local_48 + -1, -1 < local_48) {
        if (local_48 < dd->size) {
          local_54 = dd->invperm[local_48];
        }
        else {
          local_54 = local_48;
        }
        if (support_00[local_54] == 1) {
          pDVar2 = cuddUniqueInter(dd,local_54,dd->one,(DdNode *)((ulong)dd->one ^ 1));
          pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          pDVar3 = cuddBddAndRecur(dd,tmp,pDVar2);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,tmp);
            Cudd_RecursiveDeref(dd,pDVar2);
            tmp = (DdNode *)0x0;
            break;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,tmp);
          Cudd_RecursiveDeref(dd,pDVar2);
          tmp = pDVar3;
        }
      }
    } while (dd->reordered == 1);
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    if (tmp != (DdNode *)0x0) {
      *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + -1;
    }
    dd_local = (DdManager *)tmp;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Extra_bddSupportNegativeCube( DdManager * dd, DdNode * f )
{
    int *support;
    DdNode *res, *tmp, *var;
    int i, j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax( dd->size, dd->sizeZ );
    support = ABC_ALLOC( int, size );
    if ( support == NULL )
    {
        dd->errorCode = CUDD_MEMORY_OUT;
        return ( NULL );
    }
    for ( i = 0; i < size; i++ )
    {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep2( Cudd_Regular( f ), support );
    ddClearFlag2( Cudd_Regular( f ) );

    /* Transform support from array to cube. */
    do
    {
        dd->reordered = 0;
        res = DD_ONE( dd );
        cuddRef( res );
        for ( j = size - 1; j >= 0; j-- )
        {                        /* for each level bottom-up */
            i = ( j >= dd->size ) ? j : dd->invperm[j];
            if ( support[i] == 1 )
            {
                var = cuddUniqueInter( dd, i, dd->one, Cudd_Not( dd->one ) );
                //////////////////////////////////////////////////////////////////
                var = Cudd_Not(var);
                //////////////////////////////////////////////////////////////////
                cuddRef( var );
                tmp = cuddBddAndRecur( dd, res, var );
                if ( tmp == NULL )
                {
                    Cudd_RecursiveDeref( dd, res );
                    Cudd_RecursiveDeref( dd, var );
                    res = NULL;
                    break;
                }
                cuddRef( tmp );
                Cudd_RecursiveDeref( dd, res );
                Cudd_RecursiveDeref( dd, var );
                res = tmp;
            }
        }
    }
    while ( dd->reordered == 1 );

    ABC_FREE( support );
    if ( res != NULL )
        cuddDeref( res );
    return ( res );

}